

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O2

void __thiscall FuncInfo::Dump(FuncInfo *this)

{
  undefined4 uVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  undefined4 in_EAX;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar1 = *(undefined4 *)&this->field_0xb4;
  auVar7._4_4_ = uVar1;
  auVar7._0_4_ = uVar1;
  auVar7._8_4_ = uVar1;
  auVar7._12_4_ = uVar1;
  auVar7 = auVar7 & _DAT_00f0d690;
  auVar8._0_4_ = -(uint)(auVar7._0_4_ == 0);
  auVar8._4_4_ = -(uint)(auVar7._4_4_ == 0);
  auVar8._8_4_ = -(uint)(auVar7._8_4_ == 0);
  auVar8._12_4_ = -(uint)(auVar7._12_4_ == 0);
  uVar6 = movmskps(in_EAX,auVar8);
  pcVar2 = L"LdTrue";
  pcVar3 = L"LdTrue";
  if ((uVar6 & 8) != 0) {
    pcVar3 = L"LdFalse";
  }
  pcVar4 = L"LdTrue";
  if ((uVar6 & 4) != 0) {
    pcVar4 = L"LdFalse";
  }
  pcVar5 = L"LdTrue";
  if ((uVar6 & 2) != 0) {
    pcVar5 = L"LdFalse";
  }
  if ((uVar6 & 1) != 0) {
    pcVar2 = L"LdFalse";
  }
  Output::Print(L"FuncInfo: CallsEval:%s ChildCallsEval:%s HasArguments:%s HasHeapArguments:%s\n",
                pcVar3 + 2,pcVar4 + 2,pcVar5 + 2,pcVar2 + 2);
  return;
}

Assistant:

void FuncInfo::Dump()
{
    Output::Print(_u("FuncInfo: CallsEval:%s ChildCallsEval:%s HasArguments:%s HasHeapArguments:%s\n"),
        IsTrueOrFalse(this->GetCallsEval()),
        IsTrueOrFalse(this->GetChildCallsEval()),
        IsTrueOrFalse(this->GetHasArguments()),
        IsTrueOrFalse(this->GetHasHeapArguments()));
}